

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O1

int CVmObjFile::s_getp_open_text(vm_val_t *retval,uint *in_argc,int is_resource_file,vm_rcdesc *rc)

{
  char *__s;
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  CVmHostIfc *pCVar3;
  long lVar4;
  void *pvVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  int iVar8;
  CVmNetFile *netfile;
  size_t sVar9;
  undefined4 extraout_var;
  _func_int **pp_Var10;
  FILE *pFVar11;
  CVmDataSource *fp;
  CVmNativeCodeDesc *desc;
  uint argc;
  long *in_FS_OFFSET;
  bool bVar12;
  int access;
  unsigned_long res_len;
  err_frame_t err_cur__;
  int local_124;
  FILE *local_120;
  long local_118;
  uint local_110 [2];
  long local_108;
  void *local_100;
  __jmp_buf_tag local_f8;
  
  if (in_argc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *in_argc;
  }
  if (s_getp_open_text(vm_val_t*,unsigned_int*,int,vm_rcdesc_const*)::desc_file == '\0') {
    s_getp_open_text();
  }
  if (s_getp_open_text(vm_val_t*,unsigned_int*,int,vm_rcdesc_const*)::desc_res == '\0') {
    s_getp_open_text();
  }
  desc = &s_getp_open_text::desc_res;
  if (is_resource_file == 0) {
    desc = &s_getp_open_text::desc_file;
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,in_argc,desc);
  if (iVar6 != 0) {
    return 1;
  }
  local_124 = 0;
  netfile = get_filename_and_access(rc,&local_124,is_resource_file,7,"text/plain");
  G_err_frame::__tls_init();
  local_108 = *in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)local_110;
  local_110[0] = _setjmp(&local_f8);
  if (local_110[0] != 0) goto LAB_0028490a;
  vVar7 = get_charset_arg(2,argc);
  iVar6 = local_124;
  pvVar2 = sp_;
  pvVar1 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar1 = VM_OBJ;
  (pvVar2->val).obj = vVar7;
  pCVar3 = G_host_ifc_X;
  switch(local_124) {
  case 1:
    if (is_resource_file == 0) {
      pFVar11 = fopen(netfile->lclfname,"rb");
      if (pFVar11 == (FILE *)0x0) {
        bVar12 = true;
        fp = (CVmDataSource *)0x0;
      }
      else {
        fp = (CVmDataSource *)operator_new(0x10);
        fp->_vptr_CVmDataSource = (_func_int **)&PTR__CVmFileSource_00352db0;
        fp[1]._vptr_CVmDataSource = (_func_int **)pFVar11;
        bVar12 = false;
      }
    }
    else {
      __s = netfile->lclfname;
      sVar9 = strlen(__s);
      iVar8 = (*pCVar3->_vptr_CVmHostIfc[0xe])(pCVar3,__s,sVar9,&local_118);
      pFVar11 = (FILE *)CONCAT44(extraout_var,iVar8);
      bVar12 = pFVar11 == (FILE *)0x0;
      if (bVar12) {
        fp = (CVmDataSource *)0x0;
      }
      else {
        local_120 = pFVar11;
        pp_Var10 = (_func_int **)ftell(pFVar11);
        fp = (CVmDataSource *)operator_new(0x20);
        fp->_vptr_CVmDataSource = (_func_int **)&PTR__CVmResFileSource_0036c1d0;
        fp[1]._vptr_CVmDataSource = (_func_int **)local_120;
        fp[2]._vptr_CVmDataSource = pp_Var10;
        fp[3]._vptr_CVmDataSource = (_func_int **)(local_118 + (long)pp_Var10);
      }
    }
    if (bVar12) {
      CVmRun::throw_new_class(&G_interpreter_X,G_predef_X.file_not_found_exc,0,"file not found");
    }
    iVar8 = 1;
    break;
  case 2:
    pFVar11 = fopen(netfile->lclfname,"wb");
    if (pFVar11 == (FILE *)0x0) {
      CVmRun::throw_new_class(&G_interpreter_X,G_predef_X.file_creation_exc,0,"error creating file")
      ;
    }
    fp = (CVmDataSource *)operator_new(0x10);
    fp->_vptr_CVmDataSource = (_func_int **)&PTR__CVmFileSource_00352db0;
    fp[1]._vptr_CVmDataSource = (_func_int **)pFVar11;
    iVar8 = 0;
    break;
  case 3:
    pFVar11 = (FILE *)osfoprwb(netfile->lclfname,7);
    goto LAB_002847b3;
  case 4:
    pFVar11 = fopen(netfile->lclfname,"w+b");
LAB_002847b3:
    if (pFVar11 == (FILE *)0x0) {
      CVmRun::throw_new_class(&G_interpreter_X,G_predef_X.file_open_exc,0,"error opening file");
    }
    fp = (CVmDataSource *)operator_new(0x10);
    fp->_vptr_CVmDataSource = (_func_int **)&PTR__CVmFileSource_00352db0;
    fp[1]._vptr_CVmDataSource = (_func_int **)pFVar11;
    iVar8 = 1;
    break;
  default:
    err_throw(0x902);
  }
  vVar7 = create(0,netfile,vVar7,fp,1,iVar6,iVar8);
  retval->typ = VM_OBJ;
  (retval->val).obj = vVar7;
  sp_ = sp_ + -(long)(int)(argc + 1);
  netfile = (CVmNetFile *)0x0;
LAB_0028490a:
  if ((-1 < (short)local_110[0]) &&
     (local_110[0] = local_110[0] | 0x8000, netfile != (CVmNetFile *)0x0)) {
    CVmNetFile::abandon(netfile);
  }
  lVar4 = local_108;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = lVar4;
  if ((local_110[0] & 0x4001) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pvVar5 = local_100;
    G_err_frame::__tls_init();
    *(void **)(*in_FS_OFFSET + 0x10) = pvVar5;
    err_rethrow();
  }
  if ((local_110[0] & 2) != 0) {
    free(local_100);
  }
  return 1;
}

Assistant:

int CVmObjFile::s_getp_open_text(VMG_ vm_val_t *retval, uint *in_argc,
                                 int is_resource_file, const vm_rcdesc *rc)
{
    /* check arguments */
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc_file(2, 1);
    static CVmNativeCodeDesc desc_res(1, 1);
    if (get_prop_check_argc(retval, in_argc,
                            is_resource_file ? &desc_res : &desc_file))
        return TRUE;

    /* 
     *   retrieve the filename and access mode arguments, and set up network
     *   storage server access if applicable 
     */
    int access = 0;
    CVmNetFile *netfile = get_filename_and_access(
        vmg_ rc, &access, is_resource_file, OSFTTEXT, "text/plain");

    err_try
    {
        /* presume we won't need a read buffer */
        int create_readbuf = FALSE;

        /* retrieve the character set object */
        vm_obj_id_t cset_obj = get_charset_arg(vmg_ 2, argc);

        /* push the character map object onto the stack for gc protection */
        G_stk->push()->set_obj(cset_obj);
        
        /* open the file for reading or writing, as appropriate */
        CVmDataSource *ds = 0;
        osfildef *fp = 0;
        switch(access)
        {
        case VMOBJFILE_ACCESS_READ:
            /* open a resource file or file system file, as appropriate */
            if (is_resource_file)
            {
                /* it's a resource - open it */
                unsigned long res_len;
                fp = G_host_ifc->find_resource(
                    netfile->lclfname, strlen(netfile->lclfname), &res_len);
                
                /* 
                 *   if we found the resource, note the start and end seek
                 *   positions, so we can limit reading of the underlying
                 *   file to the section that contains the resource data 
                 */
                if (fp != 0)
                {
                    /* 
                     *   find_resource() handed us back a file handle
                     *   positioned at the start of the resource data stream,
                     *   possibly within a larger file; note the current
                     *   offset as the starting offset in case we need to
                     *   seek within the resource later 
                     */
                    long res_start = osfpos(fp);
                    
                    /* 
                     *   note where the resource ends - it might be embedded
                     *   within a larger file, so we need to limit reading to
                     *   the extent from the resource map 
                     */
                    long res_end = res_start + res_len;
                    
                    /* create the data source */
                    ds = new CVmResFileSource(fp, res_start, res_end);
                }
            }
            else
            {
                /* 
                 *   It's not a resource - open an ordinary text file for
                 *   reading.  Even though we're going to treat the file as a
                 *   text file, open it in binary mode, since we'll do our
                 *   own universal newline translations; this allows us to
                 *   work with files in any character set, and using almost
                 *   any newline conventions, so files copied from other
                 *   systems will be fully usable even if they haven't been
                 *   fixed up to local conventions.  
                 */
                fp = osfoprb(netfile->lclfname, OSFTTEXT);

                /* if that worked, create the data source */
                if (fp != 0)
                    ds = new CVmFileSource(fp);
            }
            
            /* make sure we opened it successfully */
            if (fp == 0)
                G_interpreter->throw_new_class(
                    vmg_ G_predef->file_not_found_exc,
                    0, "file not found");

            /* we need a read buffer */
            create_readbuf = TRUE;
            break;
            
        case VMOBJFILE_ACCESS_WRITE:
            /* open for writing */
            fp = osfopwb(netfile->lclfname, OSFTTEXT);
            
            /* make sure we created it successfully */
            if (fp == 0)
                G_interpreter->throw_new_class(
                    vmg_ G_predef->file_creation_exc,
                    0, "error creating file");

            /* create the data source */
            ds = new CVmFileSource(fp);
            break;

        case VMOBJFILE_ACCESS_RW_KEEP:
            /* open for read/write, keeping existing contents */
            fp = osfoprwb(netfile->lclfname, OSFTTEXT);
            
            /* make sure we were able to find or create the file */
            if (fp == 0)
                G_interpreter->throw_new_class(vmg_ G_predef->file_open_exc,
                                               0, "error opening file");
            
            /* create the data source */
            ds = new CVmFileSource(fp);

            /* we need a read buffer */
            create_readbuf = TRUE;
            break;
            
        case VMOBJFILE_ACCESS_RW_TRUNC:
            /* open for read/write, truncating existing contents */
            fp = osfoprwtb(netfile->lclfname, OSFTTEXT);
            
            /* make sure we were successful */
            if (fp == 0)
                G_interpreter->throw_new_class(vmg_ G_predef->file_open_exc,
                                               0, "error opening file");
            
            /* create the data source */
            ds = new CVmFileSource(fp);

            /* we need a read buffer */
            create_readbuf = TRUE;
            break;
            
        default:
            /* invalid access mode */
            fp = 0;
            err_throw(VMERR_BAD_VAL_BIF);
        }
        
        /* create our file object */
        retval->set_obj(create(vmg_ FALSE, netfile, cset_obj, ds,
                               VMOBJFILE_MODE_TEXT, access, create_readbuf));

        /* 
         *   the network file descriptor is stored in the File object now, so
         *   we no longer need to delete it 
         */
        netfile = 0;

        /* discard arguments and gc protection */
        G_stk->discard(argc + 1);
    }